

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_measurement.cpp
# Opt level: O3

void __thiscall
fixedPreciseMeasurement_opsV2_Test::TestBody(fixedPreciseMeasurement_opsV2_Test *this)

{
  precise_unit *desired_units;
  double dVar1;
  undefined1 auVar2 [16];
  unit uVar3;
  bool bVar4;
  internal iVar5;
  unit_data uVar6;
  char *pcVar7;
  char *in_R9;
  uint uVar8;
  pointer *__ptr;
  precise_unit pVar9;
  AssertionResult gtest_ar;
  fixed_precise_measurement spd;
  precise_measurement m3;
  fixed_precise_measurement d2;
  fixed_precise_measurement d1;
  undefined1 local_108 [8];
  unit uStack_100;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f8;
  undefined1 local_e8 [8];
  unit uStack_e0;
  unit local_d8 [2];
  undefined1 local_c8 [8];
  unit local_c0;
  unit uStack_b8;
  undefined1 local_b0 [8];
  unit local_a8;
  unit uStack_a0;
  AssertHelper local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_90;
  undefined1 local_88 [24];
  AssertHelper local_70;
  undefined1 local_68 [16];
  unit uStack_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_50;
  AssertHelperData *local_48;
  undefined1 auStack_40 [8];
  unit uStack_38;
  
  local_48 = (AssertHelperData *)&DAT_4046800000000000;
  auStack_40 = (undefined1  [8])0x3ff0000000000000;
  uStack_38.multiplier_ = 1.4013e-45;
  uStack_38.base_units_ = (unit_data)0x0;
  local_68._0_8_ = &DAT_4053c00000000000;
  local_68._8_8_ = 0x3ff0000000000000;
  uStack_58.multiplier_ = 1.4013e-45;
  uStack_58.base_units_ = (unit_data)0x0;
  local_108 = (undefined1  [8])&DAT_3ff0000000000000;
  uStack_100 = (unit)0x1;
  uVar6 = units::detail::unit_data::operator*((unit_data *)&uStack_38,(unit_data *)(local_108 + 8));
  uVar8 = (uint)uStack_100.base_units_ | (uint)uStack_38.base_units_;
  local_e8 = (undefined1  [8])&DAT_40abc60000000000;
  local_b0 = (undefined1  [8])&DAT_40abc60000000000;
  testing::internal::CmpHelperEQ<double,double>
            ((internal *)local_108,"area.value()","45.0 * 79",(double *)local_e8,(double *)local_b0)
  ;
  if (local_108[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_e8);
    if (uStack_100 == (unit)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = ((_Alloc_hider *)uStack_100)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,0x2d1,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_b0,(Message *)local_e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_b0);
    if (local_e8 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_e8 + 8))();
    }
  }
  if (uStack_100 != (unit)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_108 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)uStack_100);
  }
  local_108 = (undefined1  [8])&DAT_3ff0000000000000;
  uStack_100 = (unit)CONCAT44(uVar8,uVar6);
  uVar6 = units::detail::unit_data::operator*
                    ((unit_data *)((long)&units::m + 4),(unit_data *)((long)&units::m + 4));
  local_b0 = (undefined1  [8])((ulong)(uint)uVar6 << 0x20 | 0x3f800000);
  bVar4 = units::precise_unit::operator==((precise_unit *)local_108,(unit *)local_b0);
  local_e8[0] = bVar4;
  uStack_e0 = (unit)0x0;
  if (!bVar4) {
    testing::Message::Message((Message *)local_b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_108,(internal *)local_e8,(AssertionResult *)"area.units() == m * m",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,0x2d2,(char *)local_108);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_c8,(Message *)local_b0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_c8);
    if (local_108 != (undefined1  [8])&local_f8) {
      operator_delete((void *)local_108,local_f8._M_allocated_capacity + 1);
    }
    if ((unit)local_b0 != (unit)0x0) {
      (**(code **)(*(long *)local_b0 + 8))();
    }
    if (uStack_e0 != (unit)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(local_e8 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)uStack_e0);
    }
  }
  uStack_e0 = uStack_58;
  local_e8 = (undefined1  [8])local_68._8_8_;
  local_88._8_4_ = SUB84((double)local_68._8_8_ * (double)auStack_40,0);
  local_88._0_8_ = (double)local_68._0_8_ * (double)local_48;
  local_88._12_4_ = (int)((ulong)((double)local_68._8_8_ * (double)auStack_40) >> 0x20);
  uVar6 = units::detail::unit_data::operator*((unit_data *)&uStack_38,(unit_data *)(local_e8 + 8));
  local_f8._M_allocated_capacity =
       CONCAT44((uint)uStack_e0.base_units_ | (uint)uStack_38.base_units_,uVar6);
  local_108 = (undefined1  [8])local_88._0_8_;
  uStack_100.multiplier_ = (float)local_88._8_4_;
  uStack_100.base_units_ = (unit_data)local_88._12_4_;
  local_a8 = uStack_38;
  local_b0 = auStack_40;
  local_88._8_4_ = SUB84((double)auStack_40 * (double)local_68._8_8_,0);
  local_88._0_8_ = (double)local_48 * (double)local_68._0_8_;
  local_88._12_4_ = (int)((ulong)((double)auStack_40 * (double)local_68._8_8_) >> 0x20);
  local_d8[0].multiplier_ =
       units::detail::unit_data::operator*((unit_data *)&uStack_58,(unit_data *)(local_b0 + 8));
  auVar2 = local_88._0_16_;
  local_d8[0].base_units_ = (unit_data)((uint)local_a8.base_units_ | (uint)uStack_58.base_units_);
  local_e8 = (undefined1  [8])local_88._0_8_;
  uStack_e0.multiplier_ = (float)local_88._8_4_;
  uStack_e0.base_units_ = (unit_data)local_88._12_4_;
  local_88._0_16_ = auVar2;
  bVar4 = units::precise_measurement::operator==
                    ((precise_measurement *)local_108,(precise_measurement *)local_e8);
  local_c8[0] = (internal)bVar4;
  local_c0 = (unit)0x0;
  if (!bVar4) {
    testing::Message::Message((Message *)local_e8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_108,(internal *)local_c8,(AssertionResult *)"d1 * d2 == d2 * d1",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,0x2d4,(char *)local_108);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_b0,(Message *)local_e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_b0);
    if (local_108 != (undefined1  [8])&local_f8) {
      operator_delete((void *)local_108,local_f8._M_allocated_capacity + 1);
    }
    if (local_e8 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_e8 + 8))();
    }
    if (local_c0 != (unit)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(local_c8 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c0);
    }
  }
  desired_units = (precise_unit *)(local_68 + 8);
  local_108 = (undefined1  [8])local_68._0_8_;
  uStack_100.multiplier_ = (float)local_68._8_4_;
  uStack_100.base_units_ = (unit_data)local_68._12_4_;
  local_f8._M_allocated_capacity._0_4_ = uStack_58.multiplier_;
  local_f8._M_allocated_capacity._4_4_ = uStack_58.base_units_;
  local_88._0_8_ = local_48;
  dVar1 = units::precise_measurement::value_as
                    ((precise_measurement *)local_108,(precise_unit *)auStack_40);
  uVar3 = uStack_38;
  local_e8 = (undefined1  [8])(dVar1 + (double)local_88._0_8_);
  local_88._0_8_ = auStack_40;
  local_b0 = (undefined1  [8])&DAT_405f000000000000;
  testing::internal::CmpHelperEQ<double,double>
            ((internal *)local_108,"sum.value()","45.0 + 79.0",(double *)local_e8,(double *)local_b0
            );
  if (local_108[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_e8);
    if (uStack_100 == (unit)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = ((_Alloc_hider *)uStack_100)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,0x2d7,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_b0,(Message *)local_e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_b0);
    if (local_e8 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_e8 + 8))();
    }
  }
  if (uStack_100 != (unit)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_108 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)uStack_100);
  }
  local_108 = (undefined1  [8])local_88._0_8_;
  uStack_100 = uVar3;
  bVar4 = units::precise_unit::operator==((precise_unit *)local_108,(unit *)&units::m);
  local_e8[0] = bVar4;
  uStack_e0 = (unit)0x0;
  if (!bVar4) {
    testing::Message::Message((Message *)local_b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_108,(internal *)local_e8,(AssertionResult *)"sum.units() == m",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,0x2d8,(char *)local_108);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_c8,(Message *)local_b0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_c8);
    if (local_108 != (undefined1  [8])&local_f8) {
      operator_delete((void *)local_108,(ulong)(local_f8._M_allocated_capacity + 1));
    }
    if ((unit)local_b0 != (unit)0x0) {
      (**(code **)(*(long *)local_b0 + 8))();
    }
    if (uStack_e0 != (unit)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(local_e8 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)uStack_e0);
    }
  }
  local_e8 = (undefined1  [8])local_68._0_8_;
  uStack_e0.multiplier_ = (float)local_68._8_4_;
  uStack_e0.base_units_ = (unit_data)local_68._12_4_;
  local_d8[0] = uStack_58;
  local_88._0_8_ = local_48;
  dVar1 = units::precise_measurement::value_as
                    ((precise_measurement *)local_e8,(precise_unit *)auStack_40);
  local_108 = (undefined1  [8])(dVar1 + (double)local_88._0_8_);
  uStack_100.multiplier_ = (float)auStack_40._0_4_;
  uStack_100.base_units_ = (unit_data)auStack_40._4_4_;
  local_f8._M_allocated_capacity._0_4_ = uStack_38.multiplier_;
  local_f8._M_allocated_capacity._4_4_ = uStack_38.base_units_;
  local_c8 = (undefined1  [8])local_48;
  local_c0.multiplier_ = (float)auStack_40._0_4_;
  local_c0.base_units_ = (unit_data)auStack_40._4_4_;
  uStack_b8 = uStack_38;
  local_88._0_8_ = local_68._0_8_;
  dVar1 = units::precise_measurement::value_as((precise_measurement *)local_c8,desired_units);
  local_b0 = (undefined1  [8])(dVar1 + (double)local_88._0_8_);
  local_a8.multiplier_ = (float)local_68._8_4_;
  local_a8.base_units_ = (unit_data)local_68._12_4_;
  uStack_a0 = uStack_58;
  bVar4 = units::fixed_precise_measurement::operator==
                    ((fixed_precise_measurement *)local_108,(fixed_precise_measurement *)local_b0);
  local_98.data_._0_1_ = bVar4;
  local_90 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!bVar4) {
    testing::Message::Message((Message *)local_e8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_108,(internal *)&local_98,(AssertionResult *)"d1 + d2 == d2 + d1",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,0x2d9,(char *)local_108);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_b0,(Message *)local_e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_b0);
    if (local_108 != (undefined1  [8])&local_f8) {
      operator_delete((void *)local_108,local_f8._M_allocated_capacity + 1);
    }
    if (local_e8 != (undefined1  [8])0x0) {
      (**(code **)(*(size_type *)local_e8 + 8))();
    }
    if (local_90 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_90,local_90);
    }
  }
  local_108 = (undefined1  [8])local_48;
  uStack_100.multiplier_ = (float)auStack_40._0_4_;
  uStack_100.base_units_ = (unit_data)auStack_40._4_4_;
  local_f8._M_allocated_capacity._0_4_ = uStack_38.multiplier_;
  local_f8._M_allocated_capacity._4_4_ = uStack_38.base_units_;
  local_88._0_8_ = local_68._0_8_;
  dVar1 = units::precise_measurement::value_as((precise_measurement *)local_108,desired_units);
  uVar3 = uStack_58;
  local_e8 = (undefined1  [8])((double)local_88._0_8_ - dVar1);
  local_88._0_8_ = local_68._8_8_;
  local_b0 = (undefined1  [8])&DAT_4041000000000000;
  testing::internal::CmpHelperEQ<double,double>
            ((internal *)local_108,"diff.value()","79.0 - 45",(double *)local_e8,(double *)local_b0)
  ;
  if (local_108[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_e8);
    if (uStack_100 == (unit)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *(char **)uStack_100;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,0x2dc,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_b0,(Message *)local_e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_b0);
    if (local_e8 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_e8 + 8))();
    }
  }
  if (uStack_100 != (unit)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_108 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)uStack_100);
  }
  local_108 = (undefined1  [8])local_88._0_8_;
  uStack_100 = uVar3;
  bVar4 = units::precise_unit::operator==((precise_unit *)local_108,(unit *)&units::m);
  local_e8[0] = bVar4;
  uStack_e0 = (unit)0x0;
  if (!bVar4) {
    testing::Message::Message((Message *)local_b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_108,(internal *)local_e8,(AssertionResult *)"diff.units() == m",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,0x2dd,(char *)local_108);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_c8,(Message *)local_b0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_c8);
    if (local_108 != (undefined1  [8])&local_f8) {
      operator_delete((void *)local_108,local_f8._M_allocated_capacity + 1);
    }
    if ((unit)local_b0 != (unit)0x0) {
      (**(code **)(*(long *)local_b0 + 8))();
    }
    if (uStack_e0 != (unit)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(local_e8 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)uStack_e0);
    }
  }
  local_88._0_8_ = (double)local_48 / (double)local_68._0_8_;
  local_108 = (undefined1  [8])local_68._8_8_;
  uStack_100 = uStack_58;
  pVar9 = units::precise_unit::operator/((precise_unit *)auStack_40,(precise_unit *)local_108);
  local_50 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)pVar9.multiplier_;
  local_e8 = (undefined1  [8])local_88._0_8_;
  local_b0 = (undefined1  [8])&DAT_3fe23a5440cf6475;
  testing::internal::CmpHelperEQ<double,double>
            ((internal *)local_108,"rat.value()","45.0 / 79",(double *)local_e8,(double *)local_b0);
  if (local_108[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_e8);
    if (uStack_100 == (unit)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *(char **)uStack_100;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,0x2e0,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_b0,(Message *)local_e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_b0);
    if (local_e8 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_e8 + 8))();
    }
  }
  if (uStack_100 != (unit)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_108 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)uStack_100);
  }
  local_108 = (undefined1  [8])local_50;
  uStack_100 = (unit)pVar9._8_8_;
  bVar4 = units::precise_unit::operator==((precise_unit *)local_108,(unit *)&units::ratio);
  local_e8[0] = bVar4;
  uStack_e0 = (unit)0x0;
  if (!bVar4) {
    testing::Message::Message((Message *)local_b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_108,(internal *)local_e8,(AssertionResult *)"rat.units() == ratio",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,0x2e1,(char *)local_108);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_c8,(Message *)local_b0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_c8);
    if (local_108 != (undefined1  [8])&local_f8) {
      operator_delete((void *)local_108,local_f8._M_allocated_capacity + 1);
    }
    if ((unit)local_b0 != (unit)0x0) {
      (**(code **)(*(long *)local_b0 + 8))();
    }
    if (uStack_e0 != (unit)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(local_e8 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)uStack_e0);
    }
  }
  local_88._0_8_ = local_68._0_8_;
  pVar9 = units::precise_unit::operator/(desired_units,(precise_unit *)units::precise::s);
  local_d8[0] = pVar9._8_8_;
  uStack_e0 = (unit)pVar9.multiplier_;
  local_e8 = (undefined1  [8])local_88._0_8_;
  local_50 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)uStack_e0;
  uStack_a0.multiplier_ =
       units::detail::unit_data::operator*
                 ((unit_data *)local_d8,(unit_data *)(units::precise::s + 8));
  uStack_a0.base_units_ = (uint32_t)local_d8[0].base_units_;
  local_b0 = (undefined1  [8])local_88._0_8_;
  local_a8 = (unit)local_50;
  iVar5 = (internal)
          units::fixed_precise_measurement::operator==
                    ((fixed_precise_measurement *)local_68,(precise_measurement *)local_b0);
  local_c0 = (unit)0x0;
  local_c8[0] = iVar5;
  if (!(bool)iVar5) {
    testing::Message::Message((Message *)&local_98);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_108,(internal *)local_c8,(AssertionResult *)"d2 == m3","false","true"
               ,in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,0x2e7,(char *)local_108);
    testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper(&local_70);
    if (local_108 != (undefined1  [8])&local_f8) {
      operator_delete((void *)local_108,local_f8._M_allocated_capacity + 1);
    }
    if (local_98.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_98.data_ + 8))();
    }
    if (local_c0 != (unit)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(local_c8 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c0);
    }
  }
  local_108 = (undefined1  [8])local_68._0_8_;
  uStack_100.multiplier_ = (float)local_68._8_4_;
  uStack_100.base_units_ = (unit_data)local_68._12_4_;
  local_f8._M_allocated_capacity._0_4_ = uStack_58.multiplier_;
  local_f8._M_allocated_capacity._4_4_ = uStack_58.base_units_;
  local_c8[0] = (internal)
                units::precise_measurement::operator==
                          ((precise_measurement *)local_b0,(precise_measurement *)local_108);
  local_c0 = (unit)0x0;
  if (!(bool)local_c8[0]) {
    testing::Message::Message((Message *)&local_98);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_108,(internal *)local_c8,(AssertionResult *)"m3 == d2","false","true"
               ,in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,0x2e8,(char *)local_108);
    testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper(&local_70);
    if (local_108 != (undefined1  [8])&local_f8) {
      operator_delete((void *)local_108,(ulong)(local_f8._M_allocated_capacity + 1));
    }
    if (local_98.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_98.data_ + 8))();
    }
    if (local_c0 != (unit)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(local_c8 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c0);
    }
  }
  local_c8 = (undefined1  [8])&DAT_4010000000000000;
  local_98.data_ = (AssertHelperData *)&DAT_4010000000000000;
  testing::internal::CmpHelperEQ<double,double>
            ((internal *)local_108,"fm3.value()","4.0",(double *)local_c8,(double *)&local_98);
  if (local_108[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_c8);
    if (uStack_100 == (unit)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = ((_Alloc_hider *)uStack_100)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,0x2ec,pcVar7);
    testing::internal::AssertHelper::operator=(&local_98,(Message *)local_c8);
    testing::internal::AssertHelper::~AssertHelper(&local_98);
    if (local_c8 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_c8 + 8))();
    }
  }
  if (uStack_100 != (unit)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_108 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)uStack_100);
  }
  local_c8 = (undefined1  [8])&DAT_3ff0000000000000;
  local_98.data_ = (AssertHelperData *)0x3ff0000000000000;
  testing::internal::CmpHelperEQ<double,double>
            ((internal *)local_108,"fm3.value()","1.0",(double *)local_c8,(double *)&local_98);
  if (local_108[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_c8);
    if (uStack_100 == (unit)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = ((_Alloc_hider *)uStack_100)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,0x2ee,pcVar7);
    testing::internal::AssertHelper::operator=(&local_98,(Message *)local_c8);
    testing::internal::AssertHelper::~AssertHelper(&local_98);
    if (local_c8 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_c8 + 8))();
    }
  }
  if (uStack_100 != (unit)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_108 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)uStack_100);
  }
  local_c8 = (undefined1  [8])&DAT_4000000000000000;
  local_98.data_ = (AssertHelperData *)0x4000000000000000;
  testing::internal::CmpHelperEQ<double,double>
            ((internal *)local_108,"v.value()","2.0",(double *)local_c8,(double *)&local_98);
  if (local_108[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_c8);
    if (uStack_100 == (unit)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = ((_Alloc_hider *)uStack_100)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,0x2f1,pcVar7);
    testing::internal::AssertHelper::operator=(&local_98,(Message *)local_c8);
    testing::internal::AssertHelper::~AssertHelper(&local_98);
    if (local_c8 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_c8 + 8))();
    }
  }
  if (uStack_100 != (unit)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_108 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)uStack_100);
  }
  return;
}

Assistant:

TEST(fixedPreciseMeasurement, opsV2)
{
    fixed_precise_measurement d1(45.0, precise::m);
    fixed_precise_measurement d2(79, precise::m);

    auto area = d1 * d2;
    EXPECT_EQ(area.value(), 45.0 * 79);
    EXPECT_TRUE(area.units() == m * m);

    EXPECT_TRUE(d1 * d2 == d2 * d1);

    auto sum = d1 + d2;
    EXPECT_EQ(sum.value(), 45.0 + 79.0);
    EXPECT_TRUE(sum.units() == m);
    EXPECT_TRUE(d1 + d2 == d2 + d1);

    auto diff = d2 - d1;
    EXPECT_EQ(diff.value(), 79.0 - 45);
    EXPECT_TRUE(diff.units() == m);

    auto rat = d1 / d2;
    EXPECT_EQ(rat.value(), 45.0 / 79);
    EXPECT_TRUE(rat.units() == ratio);

    auto m1 = d2 / precise::s;
    fixed_precise_measurement spd(m1);
    auto m3 = spd * precise::s;

    EXPECT_TRUE(d2 == m3);
    EXPECT_TRUE(m3 == d2);

    fixed_precise_measurement fm3(2.0, precise::m);
    fm3 *= 2.0;
    EXPECT_EQ(fm3.value(), 4.0);
    fm3 /= 4.0;
    EXPECT_EQ(fm3.value(), 1.0);

    auto v = fm3 *= 2.0;
    EXPECT_EQ(v.value(), 2.0);
}